

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char *__dest;
  bool bVar10;
  ulong local_68;
  size_t local_60;
  char *local_58;
  size_t *local_50;
  char *local_48;
  undefined1 local_40 [8];
  mbedtls_mpi T;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  sVar4 = mbedtls_mpi_bitlen(X);
  uVar5 = (sVar4 >> (3U < (uint)radix)) >> (0xfU < (uint)radix);
  uVar5 = uVar5 + ((int)uVar5 + 3U & 1) + 3;
  if (buflen < uVar5) {
    *olen = uVar5;
    return -8;
  }
  T.p._0_4_ = 1;
  local_40 = (undefined1  [8])0x0;
  __dest = buf;
  if (X->s == -1) {
    __dest = buf + 1;
    *buf = '-';
    buflen = buflen - 1;
  }
  local_58 = buf;
  if (radix == 0x10) {
    uVar5 = (ulong)X->n;
    lVar7 = (ulong)X->n << 3;
    bVar2 = false;
    while (bVar10 = uVar5 != 0, uVar5 = uVar5 - 1, lVar8 = 0x30, bVar10) {
      for (; lVar8 != -0x10; lVar8 = lVar8 + -8) {
        uVar9 = X->p[uVar5] >> ((char)lVar8 + 8U & 0x3f);
        uVar6 = uVar9 & 0xff;
        if (((lVar7 + lVar8 == 0) || ((int)uVar6 != 0)) || (bVar2)) {
          *__dest = "0123456789ABCDEF"[uVar6 >> 4];
          __dest[1] = "0123456789ABCDEF"[(uint)uVar9 & 0xf];
          __dest = __dest + 2;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      lVar7 = lVar7 + -8;
    }
  }
  else {
    iVar3 = mbedtls_mpi_copy((mbedtls_mpi *)local_40,X);
    if (iVar3 != 0) goto LAB_001e6d25;
    if ((short)T.p == -1) {
      T.p._0_2_ = 1;
    }
    local_48 = __dest + buflen;
    lVar7 = 0;
    local_60 = buflen;
    local_50 = olen;
    do {
      if (local_60 + lVar7 == 0) {
        iVar3 = -8;
        goto LAB_001e6d25;
      }
      iVar3 = mbedtls_mpi_mod_int(&local_68,(mbedtls_mpi *)local_40,(ulong)(uint)radix);
      if ((iVar3 != 0) ||
         (iVar3 = mbedtls_mpi_div_int((mbedtls_mpi *)local_40,(mbedtls_mpi *)0x0,
                                      (mbedtls_mpi *)local_40,(ulong)(uint)radix), iVar3 != 0))
      goto LAB_001e6d25;
      bVar1 = (byte)local_68 + 0x37;
      if (local_68 < 10) {
        bVar1 = (byte)local_68 | 0x30;
      }
      local_48[lVar7 + -1] = bVar1;
      iVar3 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_40,0);
      lVar7 = lVar7 + -1;
    } while (iVar3 != 0);
    memmove(__dest,local_48 + lVar7,-lVar7);
    __dest = __dest + -lVar7;
    olen = local_50;
  }
  *__dest = '\0';
  *olen = (size_t)(__dest + (1 - (long)local_58));
  iVar3 = 0;
LAB_001e6d25:
  mbedtls_mpi_free((mbedtls_mpi *)local_40);
  return iVar3;
}

Assistant:

int mbedtls_mpi_write_string(const mbedtls_mpi *X, int radix,
                             char *buf, size_t buflen, size_t *olen)
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;
    MPI_VALIDATE_RET(X    != NULL);
    MPI_VALIDATE_RET(olen != NULL);
    MPI_VALIDATE_RET(buflen == 0 || buf != NULL);

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    n = mbedtls_mpi_bitlen(X);   /* Number of bits necessary to present `n`. */
    if (radix >=  4) {
        n >>= 1;                 /* Number of 4-adic digits necessary to present
                                  * `n`. If radix > 4, this might be a strict
                                  * overapproximation of the number of
                                  * radix-adic digits needed to present `n`. */
    }
    if (radix >= 16) {
        n >>= 1;                 /* Number of hexadecimal digits necessary to
                                  * present `n`. */

    }
    n += 1; /* Terminating null byte */
    n += 1; /* Compensate for the divisions above, which round down `n`
             * in case it's not even. */
    n += 1; /* Potential '-'-sign. */
    n += (n & 1);   /* Make n even to have enough space for hexadecimal writing,
                     * which always uses an even number of hex-digits. */

    if (buflen < n) {
        *olen = n;
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    p = buf;
    mbedtls_mpi_init(&T);

    if (X->s == -1) {
        *p++ = '-';
        buflen--;
    }

    if (radix == 16) {
        int c;
        size_t i, j, k;

        for (i = X->n, k = 0; i > 0; i--) {
            for (j = ciL; j > 0; j--) {
                c = (X->p[i - 1] >> ((j - 1) << 3)) & 0xFF;

                if (c == 0 && k == 0 && (i + j) != 2) {
                    continue;
                }

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&T, X));

        if (T.s == -1) {
            T.s = 1;
        }

        MBEDTLS_MPI_CHK(mpi_write_hlp(&T, radix, &p, buflen));
    }

    *p++ = '\0';
    *olen = p - buf;

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}